

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9_hashmap_walk(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint uVar1;
  sxu32 sVar2;
  undefined8 *puVar3;
  jx9_hashmap_node *pNode;
  jx9_vm *pjVar4;
  void *pvVar5;
  uint uVar6;
  sxi32 sVar7;
  jx9_value *pResult;
  uint uVar8;
  jx9_value *pObj;
  jx9_hashmap_node **ppjVar9;
  jx9_value *local_80;
  anon_union_8_3_18420de5_for_x local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if ((nArg < 2) || (((*apArg)->iFlags & 0x40) == 0)) {
    pObj = pCtx->pRet;
LAB_0013868d:
    jx9MemObjRelease(pObj);
    (pObj->x).rVal = 0.0;
  }
  else {
    if (nArg == 2) {
      local_80 = (jx9_value *)0x0;
    }
    else {
      local_80 = apArg[2];
    }
    puVar3 = (undefined8 *)((*apArg)->x).pOther;
    local_68 = *puVar3;
    local_78.rVal = 0.0;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    uStack_70 = 0x20;
    uVar6 = *(uint *)((long)puVar3 + 0x2c);
    uStack_60 = local_68;
    if (uVar6 != 0) {
      ppjVar9 = (jx9_hashmap_node **)(puVar3 + 2);
      uVar8 = 0;
      do {
        pNode = *ppjVar9;
        uVar1 = pNode->nValIdx;
        pjVar4 = pNode->pMap->pVm;
        if ((uVar1 < (pjVar4->aMemObj).nUsed) &&
           (pvVar5 = (pjVar4->aMemObj).pBase, pvVar5 != (void *)0x0)) {
          sVar2 = (pjVar4->aMemObj).eSize;
          jx9HashmapExtractNodeKey(pNode,(jx9_value *)&local_78);
          sVar7 = jx9VmCallUserFunctionAp
                            ((jx9_vm *)*puVar3,apArg[1],pResult,
                             (long)pvVar5 + (ulong)(uVar1 * sVar2),&local_78,local_80,0);
          jx9MemObjRelease((jx9_value *)&local_78);
          if (sVar7 != 0) {
            pObj = pCtx->pRet;
            goto LAB_0013868d;
          }
          uVar6 = *(uint *)((long)puVar3 + 0x2c);
        }
        ppjVar9 = &pNode->pPrev;
        uVar8 = uVar8 + 1;
      } while (uVar8 < uVar6);
    }
    pObj = pCtx->pRet;
    jx9MemObjRelease(pObj);
    (pObj->x).rVal = 4.94065645841247e-324;
  }
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9_hashmap_walk(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_value *pValue, *pUserData, sKey;
	jx9_hashmap_node *pEntry;
	jx9_hashmap *pMap;
	sxi32 rc;
	sxu32 n;
	if( nArg < 2 || !jx9_value_is_json_array(apArg[0]) ){
		/* Invalid/Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	pUserData = nArg > 2 ? apArg[2] : 0;
	/* Point to the internal representation of the input hashmap */
	pMap = (jx9_hashmap *)apArg[0]->x.pOther;
	jx9MemObjInit(pMap->pVm, &sKey);
	/* Perform the desired operation */
	pEntry = pMap->pFirst;
	for( n = 0 ; n < pMap->nEntry ; n++ ){
		/* Extract the node value */
		pValue = HashmapExtractNodeValue(pEntry);
		if( pValue ){
			/* Extract the entry key */
			jx9HashmapExtractNodeKey(pEntry, &sKey);
			/* Invoke the supplied callback */
			rc = jx9VmCallUserFunctionAp(pMap->pVm, apArg[1], 0, pValue, &sKey, pUserData, 0);
			jx9MemObjRelease(&sKey);
			if( rc != SXRET_OK ){
				/* An error occured while invoking the supplied callback [i.e: not defined] */
				jx9_result_bool(pCtx, 0); /* return FALSE */
				return JX9_OK;
			}
		}
		/* Point to the next entry */
		pEntry = pEntry->pPrev; /* Reverse link */
	}
	/* All done, return TRUE */
	jx9_result_bool(pCtx, 1);
	return JX9_OK;
}